

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line_to_quad<charls::transform_none_impl<unsigned_short>,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,quad<unsigned_short> *destination,
               size_t pixel_stride,transform_none_impl<unsigned_short> *transform)

{
  size_t sVar1;
  quad<unsigned_short> qVar2;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  for (sVar1 = 0; pixel_stride != sVar1; sVar1 = sVar1 + 1) {
    qVar2.super_triplet<unsigned_short>.field_1.v2 = source[pixel_stride_in + sVar1];
    qVar2.super_triplet<unsigned_short>.field_0.v1 = source[sVar1];
    qVar2.super_triplet<unsigned_short>.field_2.v3 =
         ((anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *)
         (source + pixel_stride_in * 2 + sVar1))->v3;
    qVar2.field_0.v4 =
         ((anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2 *)
         (source + pixel_stride_in * 3 + sVar1))->v4;
    destination[sVar1] = qVar2;
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}